

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::hoisting_visitor::operator()(hoisting_visitor *this,variable_statement *s)

{
  bool bVar1;
  list *this_00;
  reference this_01;
  wstring *__x;
  declaration *d;
  const_iterator __end2;
  const_iterator __begin2;
  list *__range2;
  variable_statement *s_local;
  hoisting_visitor *this_local;
  
  this_00 = variable_statement::l(s);
  __end2 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::begin(this_00);
  d = (declaration *)std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
                                *)&d);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
              ::operator*(&__end2);
    __x = declaration::id_abi_cxx11_(this_01);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back(&this->ids_,__x);
    __gnu_cxx::
    __normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void operator()(const variable_statement& s) {
        for (const auto& d: s.l()) {
            ids_.push_back(d.id());
        }
    }